

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
          (Proxy_Function_Impl_Base *this,
          vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *t_types)

{
  size_type sVar1;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_30;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *local_18;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *t_types_local;
  Proxy_Function_Impl_Base *this_local;
  
  local_18 = t_types;
  t_types_local = (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)this;
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (&local_30,t_types);
  sVar1 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size(local_18)
  ;
  Proxy_Function_Base::Proxy_Function_Base
            (&this->super_Proxy_Function_Base,&local_30,(int)sVar1 + -1);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~vector(&local_30);
  (this->super_Proxy_Function_Base)._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Proxy_Function_Impl_Base_00720b50;
  return;
}

Assistant:

explicit Proxy_Function_Impl_Base(const std::vector<Type_Info> &t_types)
          : Proxy_Function_Base(t_types, static_cast<int>(t_types.size()) - 1) {
      }